

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int convert_YCoCg_to_RGB(uchar *orig,int width,int height,int channels)

{
  undefined1 uVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int y_1;
  uchar a;
  int cg_1;
  int co_1;
  int cg;
  int y;
  int co;
  int i;
  undefined4 local_20;
  undefined4 local_4;
  
  if ((((in_ESI < 1) || (in_EDX < 1)) || (in_ECX < 3)) || ((4 < in_ECX || (in_RDI == 0)))) {
    local_4 = -1;
  }
  else {
    if (in_ECX == 3) {
      for (local_20 = 0;
          SBORROW4(local_20,in_ESI * in_EDX * 3) != local_20 + in_ESI * in_EDX * -3 < 0;
          local_20 = local_20 + 3) {
        iVar3 = *(byte *)(in_RDI + local_20) - 0x80;
        uVar4 = (uint)*(byte *)(in_RDI + (local_20 + 1));
        iVar5 = *(byte *)(in_RDI + (local_20 + 2)) - 0x80;
        uVar2 = clamp_byte((uVar4 + iVar3) - iVar5);
        *(uchar *)(in_RDI + local_20) = uVar2;
        uVar2 = clamp_byte(uVar4 + iVar5);
        *(uchar *)(in_RDI + (local_20 + 1)) = uVar2;
        uVar2 = clamp_byte((uVar4 - iVar3) - iVar5);
        *(uchar *)(in_RDI + (local_20 + 2)) = uVar2;
      }
    }
    else {
      for (local_20 = 0; local_20 < in_ESI * in_EDX * 4; local_20 = local_20 + 4) {
        iVar3 = *(byte *)(in_RDI + local_20) - 0x80;
        iVar5 = *(byte *)(in_RDI + (local_20 + 1)) - 0x80;
        uVar1 = *(undefined1 *)(in_RDI + (local_20 + 2));
        uVar4 = (uint)*(byte *)(in_RDI + (local_20 + 3));
        uVar2 = clamp_byte((uVar4 + iVar3) - iVar5);
        *(uchar *)(in_RDI + local_20) = uVar2;
        uVar2 = clamp_byte(uVar4 + iVar5);
        *(uchar *)(in_RDI + (local_20 + 1)) = uVar2;
        uVar2 = clamp_byte((uVar4 - iVar3) - iVar5);
        *(uchar *)(in_RDI + (local_20 + 2)) = uVar2;
        *(undefined1 *)(in_RDI + (local_20 + 3)) = uVar1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
	convert_YCoCg_to_RGB
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int co = orig[i+0] - 128;
			int y  = orig[i+1];
			int cg = orig[i+2] - 128;
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int co = orig[i+0] - 128;
			int cg = orig[i+1] - 128;
			unsigned char a  = orig[i+2];
			int y  = orig[i+3];
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
			/*	A	*/
			orig[i+3] = a;
		}
	}
	/*	done	*/
	return 0;
}